

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O3

QString * __thiscall
SecurityDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  int iVar2;
  SecurityDirWrapper *this_00;
  undefined4 extraout_var;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  if (fieldId == 2) {
    this_00 = (SecurityDirWrapper *)
              DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,this_00,1,0xc,0);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      translateType(__return_storage_ptr__,this_00,
                    (uint)*(ushort *)(CONCAT44(extraout_var,iVar2) + 6));
      return __return_storage_ptr__;
    }
  }
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateFieldContent(size_t fieldId)
{
    if (fieldId != TYPE) return "";

    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return "";

    return translateType(cert->wCertificateType);
}